

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_set_default_decoder_parameters(opj_dparameters_t *parameters)

{
  undefined4 *in_RDI;
  
  if (in_RDI != (undefined4 *)0x0) {
    memset(in_RDI,0,0x2040);
    in_RDI[1] = 0;
    *in_RDI = 0;
    in_RDI[0x80e] = 0;
    in_RDI[0x802] = 0xffffffff;
    in_RDI[0x803] = 0xffffffff;
    in_RDI[0x80f] = 0;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_set_default_decoder_parameters(opj_dparameters_t *parameters) {
	if(parameters) {
		memset(parameters, 0, sizeof(opj_dparameters_t));
		/* default decoding parameters */
		parameters->cp_layer = 0;
		parameters->cp_reduce = 0;
		parameters->cp_limit_decoding = NO_LIMITATION;

		parameters->decod_format = -1;
		parameters->cod_format = -1;
		parameters->flags = 0;		
/* UniPG>> */
#ifdef USE_JPWL
		parameters->jpwl_correct = OPJ_FALSE;
		parameters->jpwl_exp_comps = JPWL_EXPECTED_COMPONENTS;
		parameters->jpwl_max_tiles = JPWL_MAXIMUM_TILES;
#endif /* USE_JPWL */
/* <<UniPG */
	}
}